

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TType::sameCoopVecBaseType(TType *this,TType *right)

{
  bool bVar1;
  int iVar2;
  bool local_2b;
  bool local_2a;
  bool local_29;
  bool local_19;
  bool rv;
  TType *right_local;
  TType *this_local;
  
  local_19 = false;
  bVar1 = isCoopVecNV(this);
  if ((bVar1) && (bVar1 = isCoopVecNV(right), bVar1)) {
    iVar2 = (*this->_vptr_TType[7])();
    if ((iVar2 == 1) || (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 3)) {
      iVar2 = (*right->_vptr_TType[7])();
      local_29 = true;
      if (iVar2 != 1) {
        iVar2 = (*right->_vptr_TType[7])();
        local_29 = true;
        if (iVar2 != 3) {
          iVar2 = (*right->_vptr_TType[7])();
          local_29 = iVar2 == 0x19;
        }
      }
      local_19 = local_29;
    }
    else {
      iVar2 = (*this->_vptr_TType[7])();
      if (((iVar2 == 9) || (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 5)) ||
         (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 7)) {
        iVar2 = (*right->_vptr_TType[7])();
        local_2a = true;
        if (iVar2 != 9) {
          iVar2 = (*right->_vptr_TType[7])();
          local_2a = true;
          if (iVar2 != 5) {
            iVar2 = (*right->_vptr_TType[7])();
            local_2a = true;
            if (iVar2 != 7) {
              iVar2 = (*right->_vptr_TType[7])();
              local_2a = iVar2 == 0x19;
            }
          }
        }
        local_19 = local_2a;
      }
      else {
        iVar2 = (*this->_vptr_TType[7])();
        if (((iVar2 == 8) || (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 4)) ||
           (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 6)) {
          iVar2 = (*right->_vptr_TType[7])();
          local_2b = true;
          if (iVar2 != 8) {
            iVar2 = (*right->_vptr_TType[7])();
            local_2b = true;
            if (iVar2 != 4) {
              iVar2 = (*right->_vptr_TType[7])();
              local_2b = true;
              if (iVar2 != 6) {
                iVar2 = (*right->_vptr_TType[7])();
                local_2b = iVar2 == 0x19;
              }
            }
          }
          local_19 = local_2b;
        }
        else {
          local_19 = false;
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool sameCoopVecBaseType(const TType &right) const {
        bool rv = false;

        if (isCoopVecNV() && right.isCoopVecNV()) {
            if (getBasicType() == EbtFloat || getBasicType() == EbtFloat16)
                rv = right.getBasicType() == EbtFloat || right.getBasicType() == EbtFloat16 || right.getBasicType() == EbtCoopvecNV;
            else if (getBasicType() == EbtUint || getBasicType() == EbtUint8 || getBasicType() == EbtUint16)
                rv = right.getBasicType() == EbtUint || right.getBasicType() == EbtUint8 || right.getBasicType() == EbtUint16 || right.getBasicType() == EbtCoopvecNV;
            else if (getBasicType() == EbtInt || getBasicType() == EbtInt8 || getBasicType() == EbtInt16)
                rv = right.getBasicType() == EbtInt || right.getBasicType() == EbtInt8 || right.getBasicType() == EbtInt16 || right.getBasicType() == EbtCoopvecNV;
            else
                rv = false;
        }
        return rv;
    }